

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_smax64_mips(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    lVar3 = *(long *)((long)b + uVar2);
    if (*(long *)((long)b + uVar2) < *(long *)((long)a + uVar2)) {
      lVar3 = *(long *)((long)a + uVar2);
    }
    *(long *)((long)d + uVar2) = lVar3;
    uVar2 = uVar2 + 8;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_smax64_mips_cold_1();
  return;
}

Assistant:

void HELPER(gvec_smax64)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int64_t)) {
        int64_t aa = *(int64_t *)((char *)a + i);
        int64_t bb = *(int64_t *)((char *)b + i);
        int64_t dd = aa > bb ? aa : bb;
        *(int64_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}